

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O2

void __thiscall Refal2::CRuleParser::afterVariableQualifier(CRuleParser *this)

{
  int *piVar1;
  allocator local_31;
  string local_30;
  
  if ((this->super_CQualifierParser).token.type == TT_Word) {
    this->state = (TState)afterDirection;
    *(undefined8 *)&this->field_0x1e80 = 0;
    CFunctionBuilder::AddVariable
              ((CFunctionBuilder *)this,this->variableTypeTag,
               *(this->super_CQualifierParser).token.word._M_dataplus._M_p,&this->qualifier);
    std::__cxx11::string::erase((ulong)&(this->super_CQualifierParser).token.word,0);
    piVar1 = &(this->super_CQualifierParser).token.position;
    *piVar1 = *piVar1 + 1;
    wordAfterDirection(this);
    return;
  }
  std::__cxx11::string::string((string *)&local_30,"missing variable name",&local_31);
  error(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CRuleParser::afterVariableQualifier()
{
	if( token.type == TT_Word ) {
		state = &CRuleParser::afterDirection;
		CFunctionBuilder::AddVariable( variableTypeTag, token.word[0],
			&qualifier );
		token.word.erase( 0, 1 );
		token.position++;
		wordAfterDirection();
	} else {
		error( "missing variable name" );
	}
}